

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjFixup::add_fixup(CVmObjFixup *this,vm_obj_id_t old_id,vm_obj_id_t new_id)

{
  ulong idx;
  obj_fixup_entry *poVar1;
  vm_obj_id_t in_EDX;
  vm_obj_id_t in_ESI;
  CVmObjFixup *in_RDI;
  obj_fixup_entry *entry;
  
  idx = in_RDI->used_;
  in_RDI->used_ = idx + 1;
  poVar1 = get_entry(in_RDI,idx);
  poVar1->old_id = in_ESI;
  poVar1->new_id = in_EDX;
  return;
}

Assistant:

void CVmObjFixup::add_fixup(vm_obj_id_t old_id, vm_obj_id_t new_id)
{
    obj_fixup_entry *entry;

    /* allocate the next available entry */
    entry = get_entry(used_++);
    
    /* store it */
    entry->old_id = old_id;
    entry->new_id = new_id;
}